

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_rea.c
# Opt level: O2

size_t tool_read_cb(void *buffer,size_t sz,size_t nmemb,void *userdata)

{
  size_t sVar1;
  int *piVar2;
  undefined1 uVar3;
  
  sVar1 = read(*userdata,buffer,nmemb * sz);
  if ((long)sVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xb) {
      *piVar2 = 0;
      sVar1 = 0x10000001;
      uVar3 = 1;
    }
    else {
      uVar3 = 0;
      sVar1 = 0;
    }
  }
  else {
    uVar3 = 0;
  }
  *(undefined1 *)(*(long *)((long)userdata + 8) + 0x2da) = uVar3;
  return sVar1;
}

Assistant:

size_t tool_read_cb(void *buffer, size_t sz, size_t nmemb, void *userdata)
{
  ssize_t rc;
  struct InStruct *in = userdata;

  rc = read(in->fd, buffer, sz*nmemb);
  if(rc < 0) {
    if(errno == EAGAIN) {
      errno = 0;
      in->config->readbusy = TRUE;
      return CURL_READFUNC_PAUSE;
    }
    /* since size_t is unsigned we can't return negative values fine */
    rc = 0;
  }
  in->config->readbusy = FALSE;
  return (size_t)rc;
}